

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::HomeDirectorySetting::SetLocal(ClientContext *context,Value *input)

{
  bool bVar1;
  byte bVar2;
  ClientConfig *this;
  InvalidInputException *this_00;
  allocator local_41;
  string local_40;
  
  this = ClientConfig::GetConfig(context);
  bVar2 = input->is_null;
  if ((bool)bVar2 == false) {
    FileSystem::GetFileSystem(context);
    Value::ToString_abi_cxx11_(&local_40,input);
    bVar1 = FileSystem::IsRemoteFile(&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Cannot set the home directory to a remote path",&local_41);
      InvalidInputException::InvalidInputException(this_00,&local_40);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar2 = input->is_null;
  }
  if ((bVar2 & 1) == 0) {
    Value::ToString_abi_cxx11_(&local_40,input);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
  }
  ::std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void HomeDirectorySetting::SetLocal(ClientContext &context, const Value &input) {
	auto &config = ClientConfig::GetConfig(context);
	if (!input.IsNull() && FileSystem::GetFileSystem(context).IsRemoteFile(input.ToString())) {
		throw InvalidInputException("Cannot set the home directory to a remote path");
	}
	config.home_directory = input.IsNull() ? string() : input.ToString();
}